

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip,void *pMem,size_t size,mz_uint flags)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  mz_bool mVar3;
  
  if (pMem == (void *)0x0) {
    mVar2 = 0;
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  else if (size < 0x16) {
    mVar2 = 0;
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      mVar2 = 0;
    }
  }
  else {
    mVar2 = mz_zip_reader_init_internal(pZip,flags);
    if (mVar2 == 0) {
      mVar2 = 0;
    }
    else {
      pZip->m_zip_type = MZ_ZIP_TYPE_MEMORY;
      pZip->m_archive_size = size;
      pZip->m_pRead = mz_zip_mem_read_func;
      pZip->m_pIO_opaque = pZip;
      pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
      pmVar1 = pZip->m_pState;
      pmVar1->m_pMem = pMem;
      pmVar1->m_mem_size = size;
      mVar3 = mz_zip_reader_read_central_dir(pZip,flags);
      mVar2 = 1;
      if (mVar3 == 0) {
        mVar2 = 0;
        mz_zip_reader_end_internal(pZip,0);
      }
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip, const void *pMem, size_t size, mz_uint flags)
{
    if (!pMem)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_init_internal(pZip, flags))
        return MZ_FALSE;

    pZip->m_zip_type = MZ_ZIP_TYPE_MEMORY;
    pZip->m_archive_size = size;
    pZip->m_pRead = mz_zip_mem_read_func;
    pZip->m_pIO_opaque = pZip;
    pZip->m_pNeeds_keepalive = NULL;

#ifdef __cplusplus
    pZip->m_pState->m_pMem = const_cast<void *>(pMem);
#else
    pZip->m_pState->m_pMem = (void *)pMem;
#endif

    pZip->m_pState->m_mem_size = size;

    if (!mz_zip_reader_read_central_dir(pZip, flags))
    {
        mz_zip_reader_end_internal(pZip, MZ_FALSE);
        return MZ_FALSE;
    }

    return MZ_TRUE;
}